

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ClampFloatToZero_SSE2(float *src_x,float *dst_y,int width)

{
  bool bVar1;
  float fVar2;
  int iVar3;
  int width_local;
  float *dst_y_local;
  float *src_x_local;
  
  do {
    fVar2 = *src_x;
    if (*src_x <= 0.0) {
      fVar2 = 0.0;
    }
    src_x = (float *)((long)src_x + _DAT_00000004);
    *dst_y = fVar2;
    dst_y = (float *)((long)dst_y + _DAT_00000004);
    iVar3 = width + -4;
    bVar1 = 3 < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar1);
  return;
}

Assistant:

void ClampFloatToZero_SSE2(const float* src_x, float* dst_y, int width) {
  asm volatile(
      "pxor        %%xmm1,%%xmm1                 \n"

      LABELALIGN
      "1:                                        \n"
      "movd        (%0),%%xmm0                   \n"  // load float
      "maxss       %%xmm1, %%xmm0                \n"  // clamp to zero
      "add         4, %0                         \n"
      "movd        %%xmm0, (%1)                  \n"  // store float
      "add         4, %1                         \n"
      "sub         $0x4,%2                       \n"  // 1 float per loop
      "jg          1b                            \n"
      : "+r"(src_x),  // %0
        "+r"(dst_y),  // %1
        "+r"(width)   // %2
      :
      : "memory", "cc", "xmm0", "xmm1");
}